

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

void http_sconn_close(http_sconn *sc)

{
  _Bool _Var1;
  
  _Var1 = nni_atomic_flag_test_and_set(&sc->closed);
  if (_Var1) {
    return;
  }
  if (sc->finished == true) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/supplemental/http/http_server.c"
              ,0x10f,"!sc->finished");
  }
  nni_aio_close(&sc->rxaio);
  nni_aio_close(&sc->txaio);
  nni_aio_close(&sc->txdataio);
  nni_aio_close(&sc->cbaio);
  if (sc->conn != (nni_http_conn *)0x0) {
    nni_http_conn_close(sc->conn);
  }
  nni_reap(&http_sc_reap_list,sc);
  return;
}

Assistant:

static void
http_sconn_close(http_sconn *sc)
{
	nni_http_conn *conn;

	if (nni_atomic_flag_test_and_set(&sc->closed)) {
		return;
	}
	NNI_ASSERT(!sc->finished);

	nni_aio_close(&sc->rxaio);
	nni_aio_close(&sc->txaio);
	nni_aio_close(&sc->txdataio);
	nni_aio_close(&sc->cbaio);

	if ((conn = sc->conn) != NULL) {
		nni_http_conn_close(conn);
	}
	nni_reap(&http_sc_reap_list, sc);
}